

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void windowCodeRangeTest(WindowCodeArg *p,int op,int csr1,int regVal,int csr2,int lbl)

{
  u8 uVar1;
  byte bVar2;
  Parse *pParse;
  ExprList *pEVar3;
  int iVar4;
  int iVar5;
  Vdbe *p_00;
  CollSeq *pCVar6;
  int p2;
  Op *pOVar7;
  int reg;
  int iVar8;
  int op_00;
  uint op_01;
  int local_50;
  
  pParse = p->pParse;
  p_00 = sqlite3GetVdbe(pParse);
  pEVar3 = p->pMWin->pOrderBy;
  uVar1 = pParse->nTempReg;
  if (uVar1 == '\0') {
    local_50 = pParse->nMem + 1;
    pParse->nMem = local_50;
LAB_001aa3a4:
    reg = pParse->nMem + 1;
    iVar8 = reg;
  }
  else {
    bVar2 = uVar1 - 1;
    pParse->nTempReg = bVar2;
    local_50 = pParse->aTempReg[bVar2];
    if (bVar2 == 0) goto LAB_001aa3a4;
    pParse->nTempReg = uVar1 - 2;
    reg = pParse->aTempReg[(byte)(uVar1 - 2)];
    iVar8 = pParse->nMem;
  }
  iVar8 = iVar8 + 1;
  pParse->nMem = iVar8;
  p2 = pParse->nLabel + -1;
  pParse->nLabel = p2;
  windowReadPeerValues(p,csr1,local_50);
  windowReadPeerValues(p,csr2,reg);
  bVar2 = pEVar3->a[0].fg.sortFlags;
  op_01 = 0x37;
  if (op != 0x39) {
    op_01 = op == 0x36 ^ 0x39;
  }
  if ((bVar2 & 1) == 0) {
    op_01 = op;
  }
  if ((bVar2 & 2) == 0) goto LAB_001aa4e6;
  iVar4 = sqlite3VdbeAddOp3(p_00,0x33,local_50,0,0);
  iVar5 = reg;
  if (op_01 == 0x36) {
    op_00 = 0x33;
LAB_001aa469:
    sqlite3VdbeAddOp3(p_00,op_00,iVar5,lbl,0);
  }
  else {
    if (op_01 == 0x37) {
      op_00 = 0x32;
      goto LAB_001aa469;
    }
    if (op_01 == 0x39) {
      op_00 = 9;
      iVar5 = 0;
      goto LAB_001aa469;
    }
  }
  sqlite3VdbeAddOp3(p_00,9,0,p2,0);
  if (p_00->db->mallocFailed == '\0') {
    pOVar7 = p_00->aOp + iVar4;
  }
  else {
    pOVar7 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  iVar5 = lbl;
  if (op_01 == 0x39) {
    iVar5 = p2;
  }
  pOVar7->p2 = p_00->nOp;
  if (op_01 == 0x36) {
    iVar5 = p2;
  }
  sqlite3VdbeAddOp3(p_00,0x32,reg,iVar5,0);
LAB_001aa4e6:
  iVar5 = sqlite3VdbeAddOp3(p_00,0x75,0,iVar8,0);
  sqlite3VdbeChangeP4(p_00,iVar5,"",-1);
  iVar8 = sqlite3VdbeAddOp3(p_00,0x39,iVar8,0,local_50);
  if (op == 0x39) {
    sqlite3VdbeAddOp3(p_00,op_01,reg,lbl,local_50);
  }
  sqlite3VdbeAddOp3(p_00,bVar2 & 1 | 0x6a,regVal,local_50,local_50);
  if (p_00->db->mallocFailed == '\0') {
    pOVar7 = p_00->aOp + iVar8;
  }
  else {
    pOVar7 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar7->p2 = p_00->nOp;
  sqlite3VdbeAddOp3(p_00,op_01,reg,lbl,local_50);
  pCVar6 = sqlite3ExprCollSeq(pParse,pEVar3->a[0].pExpr);
  if (pCVar6 == (CollSeq *)0x0) {
    pCVar6 = pParse->db->pDfltColl;
  }
  if (p_00->db->mallocFailed == '\0') {
    pOVar7 = p_00->aOp;
    iVar8 = p_00->nOp;
    pOVar7[(long)iVar8 + -1].p4type = -2;
    pOVar7[(long)iVar8 + -1].p4.pColl = pCVar6;
  }
  if (0 < (long)p_00->nOp) {
    p_00->aOp[(long)p_00->nOp + -1].p5 = 0x80;
  }
  sqlite3VdbeResolveLabel(p_00,p2);
  if (local_50 != 0) {
    bVar2 = pParse->nTempReg;
    if ((ulong)bVar2 < 8) {
      pParse->nTempReg = bVar2 + 1;
      pParse->aTempReg[bVar2] = local_50;
    }
  }
  if (reg != 0) {
    bVar2 = pParse->nTempReg;
    if ((ulong)bVar2 < 8) {
      pParse->nTempReg = bVar2 + 1;
      pParse->aTempReg[bVar2] = reg;
    }
  }
  return;
}

Assistant:

static void windowCodeRangeTest(
  WindowCodeArg *p,
  int op,                         /* OP_Ge, OP_Gt, or OP_Le */
  int csr1,                       /* Cursor number for cursor 1 */
  int regVal,                     /* Register containing non-negative number */
  int csr2,                       /* Cursor number for cursor 2 */
  int lbl                         /* Jump destination if condition is true */
){
  Parse *pParse = p->pParse;
  Vdbe *v = sqlite3GetVdbe(pParse);
  ExprList *pOrderBy = p->pMWin->pOrderBy;  /* ORDER BY clause for window */
  int reg1 = sqlite3GetTempReg(pParse);     /* Reg. for csr1.peerVal+regVal */
  int reg2 = sqlite3GetTempReg(pParse);     /* Reg. for csr2.peerVal */
  int regString = ++pParse->nMem;           /* Reg. for constant value '' */
  int arith = OP_Add;                       /* OP_Add or OP_Subtract */
  int addrGe;                               /* Jump destination */
  int addrDone = sqlite3VdbeMakeLabel(pParse);   /* Address past OP_Ge */
  CollSeq *pColl;

  /* Read the peer-value from each cursor into a register */
  windowReadPeerValues(p, csr1, reg1);
  windowReadPeerValues(p, csr2, reg2);

  assert( op==OP_Ge || op==OP_Gt || op==OP_Le );
  assert( pOrderBy && pOrderBy->nExpr==1 );
  if( pOrderBy->a[0].fg.sortFlags & KEYINFO_ORDER_DESC ){
    switch( op ){
      case OP_Ge: op = OP_Le; break;
      case OP_Gt: op = OP_Lt; break;
      default: assert( op==OP_Le ); op = OP_Ge; break;
    }
    arith = OP_Subtract;
  }

  VdbeModuleComment((v, "CodeRangeTest: if( R%d %s R%d %s R%d ) goto lbl",
      reg1, (arith==OP_Add ? "+" : "-"), regVal,
      ((op==OP_Ge) ? ">=" : (op==OP_Le) ? "<=" : (op==OP_Gt) ? ">" : "<"), reg2
  ));

  /* If the BIGNULL flag is set for the ORDER BY, then it is required to
  ** consider NULL values to be larger than all other values, instead of
  ** the usual smaller. The VDBE opcodes OP_Ge and so on do not handle this
  ** (and adding that capability causes a performance regression), so
  ** instead if the BIGNULL flag is set then cases where either reg1 or
  ** reg2 are NULL are handled separately in the following block. The code
  ** generated is equivalent to:
  **
  **   if( reg1 IS NULL ){
  **     if( op==OP_Ge ) goto lbl;
  **     if( op==OP_Gt && reg2 IS NOT NULL ) goto lbl;
  **     if( op==OP_Le && reg2 IS NULL ) goto lbl;
  **   }else if( reg2 IS NULL ){
  **     if( op==OP_Le ) goto lbl;
  **   }
  **
  ** Additionally, if either reg1 or reg2 are NULL but the jump to lbl is
  ** not taken, control jumps over the comparison operator coded below this
  ** block.  */
  if( pOrderBy->a[0].fg.sortFlags & KEYINFO_ORDER_BIGNULL ){
    /* This block runs if reg1 contains a NULL. */
    int addr = sqlite3VdbeAddOp1(v, OP_NotNull, reg1); VdbeCoverage(v);
    switch( op ){
      case OP_Ge:
        sqlite3VdbeAddOp2(v, OP_Goto, 0, lbl);
        break;
      case OP_Gt:
        sqlite3VdbeAddOp2(v, OP_NotNull, reg2, lbl);
        VdbeCoverage(v);
        break;
      case OP_Le:
        sqlite3VdbeAddOp2(v, OP_IsNull, reg2, lbl);
        VdbeCoverage(v);
        break;
      default: assert( op==OP_Lt ); /* no-op */ break;
    }
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrDone);

    /* This block runs if reg1 is not NULL, but reg2 is. */
    sqlite3VdbeJumpHere(v, addr);
    sqlite3VdbeAddOp2(v, OP_IsNull, reg2,
                      (op==OP_Gt || op==OP_Ge) ? addrDone : lbl);
    VdbeCoverage(v);
  }

  /* Register reg1 currently contains csr1.peerVal (the peer-value from csr1).
  ** This block adds (or subtracts for DESC) the numeric value in regVal
  ** from it. Or, if reg1 is not numeric (it is a NULL, a text value or a blob),
  ** then leave reg1 as it is. In pseudo-code, this is implemented as:
  **
  **   if( reg1>='' ) goto addrGe;
  **   reg1 = reg1 +/- regVal
  **   addrGe:
  **
  ** Since all strings and blobs are greater-than-or-equal-to an empty string,
  ** the add/subtract is skipped for these, as required. If reg1 is a NULL,
  ** then the arithmetic is performed, but since adding or subtracting from
  ** NULL is always NULL anyway, this case is handled as required too.  */
  sqlite3VdbeAddOp4(v, OP_String8, 0, regString, 0, "", P4_STATIC);
  addrGe = sqlite3VdbeAddOp3(v, OP_Ge, regString, 0, reg1);
  VdbeCoverage(v);
  if( (op==OP_Ge && arith==OP_Add) || (op==OP_Le && arith==OP_Subtract) ){
    sqlite3VdbeAddOp3(v, op, reg2, lbl, reg1); VdbeCoverage(v);
  }
  sqlite3VdbeAddOp3(v, arith, regVal, reg1, reg1);
  sqlite3VdbeJumpHere(v, addrGe);

  /* Compare registers reg2 and reg1, taking the jump if required. Note that
  ** control skips over this test if the BIGNULL flag is set and either
  ** reg1 or reg2 contain a NULL value.  */
  sqlite3VdbeAddOp3(v, op, reg2, lbl, reg1); VdbeCoverage(v);
  pColl = sqlite3ExprNNCollSeq(pParse, pOrderBy->a[0].pExpr);
  sqlite3VdbeAppendP4(v, (void*)pColl, P4_COLLSEQ);
  sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
  sqlite3VdbeResolveLabel(v, addrDone);

  assert( op==OP_Ge || op==OP_Gt || op==OP_Lt || op==OP_Le );
  testcase(op==OP_Ge); VdbeCoverageIf(v, op==OP_Ge);
  testcase(op==OP_Lt); VdbeCoverageIf(v, op==OP_Lt);
  testcase(op==OP_Le); VdbeCoverageIf(v, op==OP_Le);
  testcase(op==OP_Gt); VdbeCoverageIf(v, op==OP_Gt);
  sqlite3ReleaseTempReg(pParse, reg1);
  sqlite3ReleaseTempReg(pParse, reg2);

  VdbeModuleComment((v, "CodeRangeTest: end"));
}